

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O0

bool __thiscall
v_array<node_pred>::contain_sorted(v_array<node_pred> *this,node_pred *ele,size_t *index)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *in_RDX;
  node_pred *in_RSI;
  v_array<node_pred> *in_RDI;
  node_pred *in_stack_00000030;
  v_array<node_pred> *in_stack_00000038;
  bool local_1;
  
  sVar2 = find_sorted(in_stack_00000038,in_stack_00000030);
  *in_RDX = sVar2;
  sVar2 = *in_RDX;
  sVar3 = size(in_RDI);
  if (sVar2 == sVar3) {
    local_1 = false;
  }
  else {
    bVar1 = node_pred::operator==(in_RDI->_begin + *in_RDX,*in_RSI);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool contain_sorted(const T& ele, size_t& index)
  {
    index = find_sorted(ele);

    if (index == this->size())
      return false;

    if (_begin[index] == ele)
      return true;

    return false;
  }